

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O2

int __thiscall Fl_X::set_cursor(Fl_X *this,Fl_RGB_Image *image,int hotx,int hoty)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  long lVar5;
  byte *pbVar6;
  uint *puVar7;
  int x;
  int iVar8;
  uint uVar9;
  
  iVar8 = 0;
  if ((((-1 < hotx) && (-1 < hoty && hotx < (image->super_Fl_Image).w_)) &&
      (iVar8 = 0, hoty < (image->super_Fl_Image).h_)) && (lVar3 = XcursorImageCreate(), lVar3 != 0))
  {
    iVar8 = (image->super_Fl_Image).ld_;
    iVar2 = 0;
    if (iVar8 == 0) {
      lVar5 = 0;
    }
    else {
      lVar5 = (long)(iVar8 - (image->super_Fl_Image).d_ * (image->super_Fl_Image).w_);
    }
    pbVar6 = (byte *)*(image->super_Fl_Image).data_;
    puVar7 = *(uint **)(lVar3 + 0x20);
    for (; iVar2 < (image->super_Fl_Image).h_; iVar2 = iVar2 + 1) {
      for (iVar8 = 0; iVar8 < (image->super_Fl_Image).w_; iVar8 = iVar8 + 1) {
        switch((image->super_Fl_Image).d_) {
        case 1:
          uVar9 = (uint)*pbVar6 * 0x10101;
          goto LAB_00193158;
        case 2:
          bVar1 = *pbVar6;
          uVar9 = (uint)bVar1 << 8 | (uint)bVar1 << 0x10 | (uint)pbVar6[1] << 0x18 | (uint)bVar1;
          break;
        case 3:
          uVar9 = (uint)pbVar6[2] | (uint)pbVar6[1] << 8 | (uint)*pbVar6 << 0x10;
LAB_00193158:
          uVar9 = uVar9 | 0xff000000;
          break;
        case 4:
          uVar9 = (uint)pbVar6[2] |
                  (uint)pbVar6[1] << 8 | (uint)*pbVar6 << 0x10 | (uint)pbVar6[3] << 0x18;
          break;
        default:
          goto switchD_0019312c_default;
        }
        *puVar7 = uVar9;
switchD_0019312c_default:
        pbVar6 = pbVar6 + (image->super_Fl_Image).d_;
        puVar7 = puVar7 + 1;
      }
      pbVar6 = pbVar6 + lVar5;
    }
    *(int *)(lVar3 + 0x10) = hotx;
    *(int *)(lVar3 + 0x14) = hoty;
    uVar4 = XcursorImageLoadCursor(fl_display,lVar3);
    XDefineCursor(fl_display,this->xid,uVar4);
    XFreeCursor(fl_display,uVar4);
    XcursorImageDestroy(lVar3);
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

int Fl_X::set_cursor(const Fl_RGB_Image *image, int hotx, int hoty) {
#if ! HAVE_XCURSOR
  return 0;
#else
  XcursorImage *cursor;
  Cursor xc;

  if ((hotx < 0) || (hotx >= image->w()))
    return 0;
  if ((hoty < 0) || (hoty >= image->h()))
    return 0;

  cursor = XcursorImageCreate(image->w(), image->h());
  if (!cursor)
    return 0;

  const int extra_data = image->ld() ? (image->ld()-image->w()*image->d()) : 0;
  const uchar *i = (const uchar*)*image->data();
  XcursorPixel *o = cursor->pixels;
  for (int y = 0;y < image->h();y++) {
    for (int x = 0;x < image->w();x++) {
      switch (image->d()) {
      case 1:
        *o = (0xff<<24) | (i[0]<<16) | (i[0]<<8) | i[0];
        break;
      case 2:
        *o = (i[1]<<24) | (i[0]<<16) | (i[0]<<8) | i[0];
        break;
      case 3:
        *o = (0xff<<24) | (i[0]<<16) | (i[1]<<8) | i[2];
        break;
      case 4:
        *o = (i[3]<<24) | (i[0]<<16) | (i[1]<<8) | i[2];
        break;
      }
      i += image->d();
      o++;
    }
    i += extra_data;
  }

  cursor->xhot = hotx;
  cursor->yhot = hoty;

  xc = XcursorImageLoadCursor(fl_display, cursor);
  XDefineCursor(fl_display, xid, xc);
  XFreeCursor(fl_display, xc);

  XcursorImageDestroy(cursor);

  return 1;
#endif
}